

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O0

RK_S32 __thiscall
MppMetaService::get_index_of_key(MppMetaService *this,MppMetaKey key,MppMetaType type)

{
  MppTrieInfo *pMVar1;
  uint local_34;
  MppTrieInfo *info;
  RK_U64 val;
  MppMetaType type_local;
  MppMetaKey key_local;
  MppMetaService *this_local;
  
  val._0_4_ = type;
  val._4_4_ = key;
  _type_local = this;
  info = (MppTrieInfo *)META_KEY_TO_U64(key,type);
  pMVar1 = mpp_trie_get_info(this->mTrie,(char *)&info);
  if (pMVar1 == (MppTrieInfo *)0x0) {
    local_34 = 0xffffffff;
  }
  else {
    local_34 = (uint)*pMVar1 & 0xfff;
  }
  return local_34;
}

Assistant:

RK_S32 MppMetaService::get_index_of_key(MppMetaKey key, MppMetaType type)
{
    RK_U64 val = META_KEY_TO_U64(key, type);
    MppTrieInfo *info = mpp_trie_get_info(mTrie, (const char *)&val);

    return info ? info->index : -1;
}